

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PIT.hpp
# Opt level: O0

void __thiscall
PCCompatible::i8253<false,_PCCompatible::PITObserver>::Channel::write<2>
          (Channel *this,PITObserver *observer,uint8_t value)

{
  LatchMode LVar1;
  uint8_t value_local;
  PITObserver *observer_local;
  Channel *this_local;
  
  LVar1 = this->latch_mode;
  if (LVar1 == LowOnly) {
    this->reload = this->reload & 0xff00 | (ushort)value;
  }
  else if (LVar1 == HighOnly) {
    this->reload = this->reload & 0xff | (ushort)value << 8;
  }
  else if (LVar1 == LowHigh) {
    this->next_access_high = (this->next_access_high & 1U) != 1;
    if ((this->next_access_high & 1U) != 0) {
      this->reload = this->reload & 0xff00 | (ushort)value;
      this->awaiting_reload = true;
      return;
    }
    this->reload = this->reload & 0xff | (ushort)value << 8;
  }
  this->awaiting_reload = false;
  if (this->mode == SquareWaveGenerator) {
    this->counter = this->reload & 0xfffe;
  }
  else {
    this->counter = this->reload;
  }
  return;
}

Assistant:

void write([[maybe_unused]] PITObserver &observer, uint8_t value) {
				switch(latch_mode) {
					case LatchMode::LowOnly:
						reload = (reload & 0xff00) | value;
					break;
					case LatchMode::HighOnly:
						reload = uint16_t((reload & 0x00ff) | (value << 8));
					break;
					case LatchMode::LowHigh:
						next_access_high ^= true;
						if(next_access_high) {
							reload = (reload & 0xff00) | value;
							awaiting_reload = true;
							return;
						}

						reload = uint16_t((reload & 0x00ff) | (value << 8));
					break;
				}

				awaiting_reload = false;

				switch(mode) {
					default:
						counter = reload;
					break;

					case OperatingMode::SquareWaveGenerator:
						counter = reload & ~1;
					break;
				}
			}